

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O1

bool __thiscall Saturation::ConsequenceFinder::isRedundant(ConsequenceFinder *this,Clause *cl)

{
  uint uVar1;
  char cVar2;
  Literal **ppLVar3;
  Literal **ppLVar4;
  uint uVar5;
  ulong uVar6;
  Literal **ppLVar7;
  ulong n;
  bool bVar8;
  
  uVar5 = *(uint *)&cl->field_0x38 & 0xfffff;
  bVar8 = uVar5 != 0;
  if (bVar8) {
    uVar6 = (ulong)bVar8;
    ppLVar3 = cl->_literals;
    ppLVar4 = cl->_literals + uVar6;
    do {
      n = (ulong)((*ppLVar3)->super_Term)._functor;
      cVar2 = '\x03';
      if ((*(byte *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) + n * 8) + 0x40) & 0x20) != 0) {
        if ((this->_redundant).super_Array<bool>._capacity <= n) {
          ::Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
        }
        cVar2 = (this->_redundant).super_Array<bool>._array[n];
      }
      if ((cVar2 != '\x03') && (cVar2 != '\0')) {
        return bVar8;
      }
      uVar1 = (uint)uVar6;
      ppLVar7 = ppLVar4 + 1;
      bVar8 = uVar1 < uVar5;
      if (uVar5 <= uVar1) {
        ppLVar4 = (Literal **)0x0;
      }
      uVar6 = (ulong)(uVar1 + 1);
      ppLVar3 = ppLVar4;
      ppLVar4 = ppLVar7;
    } while (uVar1 < uVar5);
  }
  return bVar8;
}

Assistant:

bool ConsequenceFinder::isRedundant(Clause* cl)
{
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      return true;
    }
  }
  return false;
}